

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

void ts_external_scanner_state_init(ExternalScannerState *self,char *data,uint length)

{
  char *pcVar1;
  uint length_local;
  char *data_local;
  ExternalScannerState *self_local;
  
  self->length = length;
  if (length < 0x19) {
    memcpy(self,data,(ulong)length);
  }
  else {
    pcVar1 = (char *)ts_malloc((ulong)length);
    (self->field_0).long_data = pcVar1;
    memcpy((self->field_0).long_data,data,(ulong)length);
  }
  return;
}

Assistant:

void ts_external_scanner_state_init(ExternalScannerState *self, const char *data, unsigned length) {
  self->length = length;
  if (length > sizeof(self->short_data)) {
    self->long_data = ts_malloc(length);
    memcpy(self->long_data, data, length);
  } else {
    memcpy(self->short_data, data, length);
  }
}